

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O2

string * __thiscall libcellml::Entity::id_abi_cxx11_(string *__return_storage_ptr__,Entity *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->mPimpl);
  return __return_storage_ptr__;
}

Assistant:

std::string Entity::id() const
{
    return pFunc()->mId;
}